

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Node.cpp
# Opt level: O0

string * __thiscall Node::label_abi_cxx11_(Node *this)

{
  bool bVar1;
  Node *in_RSI;
  string *in_RDI;
  raw_string_ostream llvmStream;
  string llvmTemporaryString;
  string *label_;
  string *__rhs;
  string local_120 [12];
  NodeType in_stack_fffffffffffffeec;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [39];
  undefined1 local_11;
  
  local_11 = 0;
  __rhs = in_RDI;
  id(in_RSI);
  std::__cxx11::to_string(in_stack_fffffffffffffefc);
  std::operator+((char *)in_RSI,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RSI,
                 (char *)__rhs);
  getType(in_RSI);
  nodeTypeToString_abi_cxx11_(in_stack_fffffffffffffeec);
  std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  bVar1 = isArtificial(in_RSI);
  if (!bVar1) {
    std::__cxx11::string::string(local_b8);
    llvm::raw_string_ostream::raw_string_ostream((raw_string_ostream *)__rhs,in_RDI);
    llvm::Value::print((raw_ostream *)in_RSI->llvmInstruction_,false);
    std::operator+((char *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                   in_stack_fffffffffffffef0);
    std::__cxx11::string::operator+=((string *)__rhs,local_120);
    std::__cxx11::string::~string(local_120);
    llvm::raw_string_ostream::~raw_string_ostream((raw_string_ostream *)0x186eb9);
    std::__cxx11::string::~string(local_b8);
  }
  std::__cxx11::string::operator+=((string *)__rhs," \"]");
  return in_RDI;
}

Assistant:

string Node::label() const {
    std::string label_ = "[label=\"<" + std::to_string(this->id()) + "> " +
                         nodeTypeToString(this->getType());
    if (!isArtificial()) {
        string llvmTemporaryString;
        raw_string_ostream llvmStream(llvmTemporaryString);
        llvmInstruction_->print(llvmStream);
        label_ += "\n" + llvmTemporaryString;
    }
    label_ += " \"]";
    return label_;
}